

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_sha512.cpp
# Opt level: O2

void __thiscall CHMAC_SHA512::CHMAC_SHA512(CHMAC_SHA512 *this,uchar *key,size_t keylen)

{
  int n;
  CSHA512 *this_00;
  long lVar1;
  long in_FS_OFFSET;
  uchar rkey [128];
  CSHA512 local_180;
  byte local_b8 [136];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA512::CSHA512(&this->outer);
  CSHA512::CSHA512(&this->inner);
  if (keylen < 0x81) {
    __memcpy_chk(local_b8,key,keylen,0x80);
    memset(local_b8 + keylen,0,0x80 - keylen);
  }
  else {
    CSHA512::CSHA512(&local_180);
    this_00 = CSHA512::Write(&local_180,key,keylen);
    CSHA512::Finalize(this_00,local_b8);
    local_b8[0x40] = 0;
    local_b8[0x41] = 0;
    local_b8[0x42] = 0;
    local_b8[0x43] = 0;
    local_b8[0x44] = 0;
    local_b8[0x45] = 0;
    local_b8[0x46] = 0;
    local_b8[0x47] = 0;
    local_b8[0x48] = 0;
    local_b8[0x49] = 0;
    local_b8[0x4a] = 0;
    local_b8[0x4b] = 0;
    local_b8[0x4c] = 0;
    local_b8[0x4d] = 0;
    local_b8[0x4e] = 0;
    local_b8[0x4f] = 0;
    local_b8[0x50] = 0;
    local_b8[0x51] = 0;
    local_b8[0x52] = 0;
    local_b8[0x53] = 0;
    local_b8[0x54] = 0;
    local_b8[0x55] = 0;
    local_b8[0x56] = 0;
    local_b8[0x57] = 0;
    local_b8[0x58] = 0;
    local_b8[0x59] = 0;
    local_b8[0x5a] = 0;
    local_b8[0x5b] = 0;
    local_b8[0x5c] = 0;
    local_b8[0x5d] = 0;
    local_b8[0x5e] = 0;
    local_b8[0x5f] = 0;
    local_b8[0x60] = 0;
    local_b8[0x61] = 0;
    local_b8[0x62] = 0;
    local_b8[99] = 0;
    local_b8[100] = 0;
    local_b8[0x65] = 0;
    local_b8[0x66] = 0;
    local_b8[0x67] = 0;
    local_b8[0x68] = 0;
    local_b8[0x69] = 0;
    local_b8[0x6a] = 0;
    local_b8[0x6b] = 0;
    local_b8[0x6c] = 0;
    local_b8[0x6d] = 0;
    local_b8[0x6e] = 0;
    local_b8[0x6f] = 0;
    local_b8[0x70] = 0;
    local_b8[0x71] = 0;
    local_b8[0x72] = 0;
    local_b8[0x73] = 0;
    local_b8[0x74] = 0;
    local_b8[0x75] = 0;
    local_b8[0x76] = 0;
    local_b8[0x77] = 0;
    local_b8[0x78] = 0;
    local_b8[0x79] = 0;
    local_b8[0x7a] = 0;
    local_b8[0x7b] = 0;
    local_b8[0x7c] = 0;
    local_b8[0x7d] = 0;
    local_b8[0x7e] = 0;
    local_b8[0x7f] = 0;
  }
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 1) {
    local_b8[lVar1] = local_b8[lVar1] ^ 0x5c;
  }
  CSHA512::Write(&this->outer,local_b8,0x80);
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 1) {
    local_b8[lVar1] = local_b8[lVar1] ^ 0x6a;
  }
  CSHA512::Write(&this->inner,local_b8,0x80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CHMAC_SHA512::CHMAC_SHA512(const unsigned char* key, size_t keylen)
{
    unsigned char rkey[128];
    if (keylen <= 128) {
        memcpy(rkey, key, keylen);
        memset(rkey + keylen, 0, 128 - keylen);
    } else {
        CSHA512().Write(key, keylen).Finalize(rkey);
        memset(rkey + 64, 0, 64);
    }

    for (int n = 0; n < 128; n++)
        rkey[n] ^= 0x5c;
    outer.Write(rkey, 128);

    for (int n = 0; n < 128; n++)
        rkey[n] ^= 0x5c ^ 0x36;
    inner.Write(rkey, 128);
}